

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var cs_impl::runtime_cs_ext::import(context_t *context,string *dir,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  cs::instance_type::import
            ((instance_type *)&stack0xffffffffffffffe0,*(string **)((dir->_M_dataplus)._M_p + 0x10),
             name);
  cs::make_namespace((cs *)context,(namespace_t *)&stack0xffffffffffffffe0);
  if ((slot_type *)local_18._M_pi != (slot_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return (var)(proxy *)context;
}

Assistant:

var import(const context_t &context, const string &dir, const string &name)
		{
			try {
				return make_namespace(context->instance->import(dir, name));
			}
			catch (...) {
				return null_pointer;
			}
		}